

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Param::set_value(Param *this,shared_ptr<kratos::Param> *param)

{
  ParamType PVar1;
  element_type *peVar2;
  element_type *peVar3;
  int64_t iVar4;
  Param *local_20;
  __shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2> *local_18;
  shared_ptr<kratos::Param> *param_local;
  Param *this_local;
  
  local_18 = &param->super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>;
  param_local = (shared_ptr<kratos::Param> *)this;
  peVar2 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)param);
  local_20 = this;
  std::
  unordered_set<kratos::Param*,std::hash<kratos::Param*>,std::equal_to<kratos::Param*>,std::allocator<kratos::Param*>>
  ::emplace<kratos::Param*>
            ((unordered_set<kratos::Param*,std::hash<kratos::Param*>,std::equal_to<kratos::Param*>,std::allocator<kratos::Param*>>
              *)&peVar2->param_params_,&local_20);
  peVar3 = std::__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
  this->parent_param_ = peVar3;
  peVar2 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  PVar1 = param_type(peVar2);
  if (PVar1 != RawType) {
    this->param_type_ = Parameter;
  }
  peVar2 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  iVar4 = Const::value(&peVar2->super_Const);
  (*(this->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(this,iVar4);
  return;
}

Assistant:

void Param::set_value(const std::shared_ptr<Param> &param) {
    param->param_params_.emplace(this);
    parent_param_ = param.get();
    if (param->param_type() != ParamType::RawType) param_type_ = ParamType::Parameter;

    // update the values
    set_value(param->value());
}